

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ILBDOperator.cpp
# Opt level: O2

void __thiscall
lts2::LBDOperator::fillBasisFunctionForIndex(LBDOperator *this,Mat *basisFunction,int idx)

{
  double dVar1;
  uint uVar2;
  IntegratingCell *pIVar3;
  Size local_2e0;
  Size local_2d8;
  _InputArray local_2d0;
  Size local_2b8;
  Mat negImg;
  Mat ROI;
  Scalar_<double> local_1f0 [11];
  Mat posImg;
  
  local_2b8 = this->_patchSize;
  cv::Mat::create(basisFunction,&local_2b8,5);
  cv::Scalar_<double>::Scalar_(local_1f0,0.0);
  _ROI = -0x3efdfffa;
  cv::noArray();
  cv::Mat::setTo((_InputArray *)basisFunction,(_InputArray *)&ROI);
  cv::Mat::Mat(&ROI);
  local_2d8 = this->_patchSize;
  cv::Scalar_<double>::Scalar_(local_1f0,0.0);
  cv::Mat::Mat(&posImg,&local_2d8,5,local_1f0);
  uVar2 = this->_basisFunctions[idx].pos_cell;
  _negImg = this->_sensitiveCells[(int)uVar2].xmin;
  dVar1 = this->_sensitiveCells[(int)uVar2].scaleFactor;
  cv::Mat::Mat((Mat *)local_1f0,&posImg,(Rect_ *)&negImg);
  cv::Mat::operator=(&ROI,(Mat *)local_1f0);
  cv::Mat::~Mat((Mat *)local_1f0);
  cv::Scalar_<double>::Scalar_(local_1f0,(double)(float)dVar1);
  _negImg = -0x3efdfffa;
  cv::noArray();
  cv::Mat::setTo((_InputArray *)&ROI,(_InputArray *)&negImg);
  local_2e0 = this->_patchSize;
  cv::Scalar_<double>::Scalar_(local_1f0,0.0);
  cv::Mat::Mat(&negImg,&local_2e0,5,local_1f0);
  pIVar3 = this->_sensitiveCells;
  uVar2 = this->_basisFunctions[idx].neg_cell;
  local_2d0.flags = pIVar3[(int)uVar2].xmin;
  local_2d0._4_4_ = pIVar3[(int)uVar2].ymin;
  dVar1 = pIVar3[(int)uVar2].scaleFactor;
  local_2d0.obj =
       (void *)CONCAT44(pIVar3[(int)uVar2].ymax - local_2d0._4_4_,
                        pIVar3[(int)uVar2].xmax - local_2d0.flags);
  cv::Mat::Mat((Mat *)local_1f0,&negImg,(Rect_ *)&local_2d0);
  cv::Mat::operator=(&ROI,(Mat *)local_1f0);
  cv::Mat::~Mat((Mat *)local_1f0);
  cv::Scalar_<double>::Scalar_(local_1f0,(double)(float)dVar1);
  local_2d0.flags = -0x3efdfffa;
  local_2d0.sz.width = 1;
  local_2d0.sz.height = 4;
  local_2d0.obj = local_1f0;
  cv::noArray();
  cv::Mat::setTo((_InputArray *)&ROI,&local_2d0);
  cv::operator-((Mat *)local_1f0,&posImg);
  (**(code **)(*(long *)local_1f0[0].super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] + 0x18))
            (local_1f0[0].super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0],local_1f0,
             basisFunction,0xffffffffffffffff);
  cv::MatExpr::~MatExpr((MatExpr *)local_1f0);
  cv::Mat::~Mat(&negImg);
  cv::Mat::~Mat(&posImg);
  cv::Mat::~Mat(&ROI);
  return;
}

Assistant:

void lts2::LBDOperator::fillBasisFunctionForIndex(cv::Mat &basisFunction, int idx) const
{
    // Output
    basisFunction.create(_patchSize, CV_32FC1);
    basisFunction.setTo(cv::Scalar(0));
    
    // Local structures needed
    lbd::IntegratingCell cell;
    int cellId;
    cv::Mat ROI;
    float value;

    //---------------//
    // Positive part //
    //---------------//
    
    cv::Mat posImg(_patchSize, CV_32F, cv::Scalar(0));
    cellId = _basisFunctions[idx].pos_cell;
    cell = _sensitiveCells[cellId];
    value = cv::saturate_cast<float>(cell.scaleFactor);
    
    // Extract ROI
    ROI = posImg(cv::Rect(cell.xmin, cell.ymin, 
                          cell.xmax-cell.xmin, cell.ymax-cell.ymin));
    
    // Set ROI to the correct value
    ROI.setTo(cv::Scalar(value));

    //---------------//
    // Negative part //
    //---------------//

    cv::Mat negImg(_patchSize, CV_32F, cv::Scalar(0));
    cellId = _basisFunctions[idx].neg_cell;
    cell = _sensitiveCells[cellId];
    value = cv::saturate_cast<float>(cell.scaleFactor);

    // Extract ROI
    ROI = negImg(cv::Rect(cell.xmin, cell.ymin, 
                          cell.xmax-cell.xmin, cell.ymax-cell.ymin));
    
    // Set ROI to the correct value
    ROI.setTo(cv::Scalar(value));
    
    //--------------//
    // Combine both //
    //--------------//
    basisFunction = posImg - negImg;
}